

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

void __thiscall ON_HistoryRecord::ON_HistoryRecord(ON_HistoryRecord *this,ON_HistoryRecord *src)

{
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,HistoryRecord,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00816a60;
  (this->m_command_id).Data1 = 0;
  (this->m_command_id).Data2 = 0;
  (this->m_command_id).Data3 = 0;
  (this->m_command_id).Data4[0] = '\0';
  (this->m_command_id).Data4[1] = '\0';
  (this->m_command_id).Data4[2] = '\0';
  (this->m_command_id).Data4[3] = '\0';
  (this->m_command_id).Data4[4] = '\0';
  (this->m_command_id).Data4[5] = '\0';
  (this->m_command_id).Data4[6] = '\0';
  (this->m_command_id).Data4[7] = '\0';
  this->m_version = 0;
  this->m_record_type = history_parameters;
  ON_UuidList::ON_UuidList(&this->m_antecedents);
  ON_UuidList::ON_UuidList(&this->m_descendants);
  (this->m_value)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00816e38;
  (this->m_value).m_a = (ON_Value **)0x0;
  (this->m_value).m_count = 0;
  (this->m_value).m_capacity = 0;
  this->m_bValuesSorted = true;
  this->m_bCopyOnReplaceObject = false;
  Internal_Copy(this,src);
  return;
}

Assistant:

ON_HistoryRecord::ON_HistoryRecord(const ON_HistoryRecord& src)
  : ON_ModelComponent(ON_ModelComponent::Type::HistoryRecord,src)
{
  Internal_Copy(src);
}